

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int os_resolve_symlink(char *fname,char *target,size_t target_size)

{
  int iVar1;
  ssize_t sVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t copylen;
  stat buf;
  size_t local_b8;
  stat local_b0;
  long local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = lstat(in_RDI,&local_b0);
  if ((iVar1 == 0) && ((local_b0.st_mode & 0xa000) != 0)) {
    local_b8 = local_b0.st_size;
    if (local_20 - 1U < (ulong)local_b0.st_size) {
      local_b8 = local_20 - 1;
    }
    sVar2 = readlink(local_10,local_18,local_b8);
    if (sVar2 < 0) {
      local_4 = 0;
    }
    else {
      local_18[local_b8] = '\0';
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
os_resolve_symlink( const char *fname, char *target, size_t target_size )
{
    // get the stat() information for the *undereferenced* link; if
    // it's not actually a link, there's nothing to resolve
    struct stat buf;
    if (lstat(fname, &buf) != 0 or (buf.st_mode & S_IFLNK) == 0)
        return false;

    // read the link contents (maxing out at the buffer size)
    size_t copylen = (size_t)buf.st_size;
    if (copylen > target_size - 1)
        copylen = target_size - 1;
    if (readlink(fname, target, copylen) < 0)
        return false;

    // null-terminate the result and return success
    target[copylen] = '\0';
    return true;
}